

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*>::expand
          (Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Lhs>::Node_*>
           *this)

{
  Node **ppNVar1;
  Node **ppNVar2;
  size_t sVar3;
  size_t i;
  size_t sVar4;
  ulong uVar5;
  size_t sVar6;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar5 = sVar6 * 8;
  if (uVar5 == 0) {
    ppNVar2 = (Node **)FixedSizeAllocator<8UL>::alloc
                                 ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar5 < 0x11) {
    ppNVar2 = (Node **)FixedSizeAllocator<16UL>::alloc
                                 ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                                 );
  }
  else if (uVar5 < 0x19) {
    ppNVar2 = (Node **)FixedSizeAllocator<24UL>::alloc
                                 ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                                 );
  }
  else if (uVar5 < 0x21) {
    ppNVar2 = (Node **)FixedSizeAllocator<32UL>::alloc
                                 ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                                 );
  }
  else if (uVar5 < 0x31) {
    ppNVar2 = (Node **)FixedSizeAllocator<48UL>::alloc
                                 ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                                 );
  }
  else if (uVar5 < 0x41) {
    ppNVar2 = (Node **)FixedSizeAllocator<64UL>::alloc
                                 ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                                 );
  }
  else {
    ppNVar2 = (Node **)::operator_new(uVar5,0x10);
  }
  sVar3 = this->_capacity;
  if (sVar3 == 0) {
    sVar3 = 0;
  }
  else {
    sVar4 = 0;
    do {
      ppNVar2[sVar4] = this->_stack[sVar4];
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
    ppNVar1 = this->_stack;
    if (ppNVar1 != (Node **)0x0) {
      uVar5 = sVar3 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar5 == 0) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = ppNVar1;
      }
      else if (uVar5 < 0x11) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = ppNVar1;
      }
      else if (uVar5 < 0x19) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = ppNVar1;
      }
      else if (uVar5 < 0x21) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = ppNVar1;
      }
      else if (uVar5 < 0x31) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = ppNVar1;
      }
      else if (uVar5 < 0x41) {
        *ppNVar1 = (Node *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = ppNVar1;
      }
      else {
        operator_delete(ppNVar1,0x10);
        sVar3 = this->_capacity;
      }
    }
  }
  this->_stack = ppNVar2;
  this->_cursor = ppNVar2 + sVar3;
  this->_end = ppNVar2 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }